

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cc
# Opt level: O2

double __thiscall calculator::ExpressionTree::calcValue(ExpressionTree *this,node *x)

{
  Tag tag;
  node *y;
  node *x_00;
  Integer IVar1;
  node *x_01;
  ExpressionTree *this_00;
  string *this_01;
  double dVar2;
  double local_88;
  string local_70;
  string local_50;
  
  if (x == (node *)0x0) {
    local_88 = 0.0;
  }
  else {
    dVar2 = calcValue(this,x->left);
    if (x->left != (node *)0x0) {
      x->left->value = dVar2;
    }
    this_00 = this;
    dVar2 = calcValue(this,x->right);
    y = x->right;
    if (y != (node *)0x0) {
      y->value = dVar2;
    }
    x_00 = x->left;
    x_01 = x_00;
    if (x_00 == (node *)0x0) {
      x_01 = y;
    }
    tag = x->type;
    if (tag < Identifier) {
      local_88 = x->value;
    }
    else if ((tag == Not) || (tag == Negate)) {
      IVar1 = calcValue(this_00,x_01,tag);
      local_88 = (double)IVar1;
    }
    else {
      if (tag == Function) {
        std::__cxx11::string::string((string *)&local_50,(string *)&x->funcname);
        local_88 = calcFunctionValue(this,x_01,&local_50);
        this_01 = &local_50;
      }
      else {
        if (tag != BinaryFunction) {
          dVar2 = calcValue(this,x_00,y,tag);
          return dVar2;
        }
        std::__cxx11::string::string((string *)&local_70,(string *)&x->funcname);
        local_88 = calcBinaryFunctionValuie(this,x_00,y,&local_70);
        this_01 = &local_70;
      }
      std::__cxx11::string::~string((string *)this_01);
      if (x->negative != false) {
        local_88 = -local_88;
      }
    }
  }
  return local_88;
}

Assistant:

double ExpressionTree::calcValue(node *x) {
    if (!x) return 0.0;

    // 更新操作符节点中的值
    double l = calcValue(x->left);
    if (x->left) x->left->value = l;
    double r = calcValue(x->right);
    if (x->right) x->right->value = r;

    node *valid_child = x->left ? x->left : x->right;
    if (x->type == Tag::Number || x->type == Tag::Float) return x->value;

    // 计算一元函数
    else if (x->type == Tag::Function) {
        double val = calcFunctionValue(valid_child, x->funcname);
        if (x->negative) return -val;
        return val;
    }
    // 计算二元函数
    else if (x->type == Tag::BinaryFunction) {
        double val = calcBinaryFunctionValuie(x->left, x->right, x->funcname);
        if (x->negative) return -val;
        return val;
    }
    // 计算一元操作符
    else if (x->type == Tag::Not || x->type == Tag::Negate)
        return (double)calcValue(valid_child, x->type);
    // 根据当前节点的tag 从孩子节点计算值 并存储到当前节点的 node.value 中
    return calcValue(x->left, x->right, x->type);
}